

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O3

bool setLogLevel(string *loglevel)

{
  int iVar1;
  char *functionName;
  
  iVar1 = std::__cxx11::string::compare((char *)loglevel);
  if (iVar1 == 0) {
    softLogLevel = 3;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)loglevel);
    if (iVar1 == 0) {
      softLogLevel = 4;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)loglevel);
      if (iVar1 == 0) {
        softLogLevel = 6;
      }
      else {
        functionName = "DEBUG";
        iVar1 = std::__cxx11::string::compare((char *)loglevel);
        if (iVar1 != 0) {
          softHSMLog(3,functionName,
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/common/log.cpp"
                     ,0x41,"Unknown value (%s) for log.level in configuration",
                     (loglevel->_M_dataplus)._M_p);
          return false;
        }
        softLogLevel = 7;
      }
    }
  }
  return true;
}

Assistant:

bool setLogLevel(const std::string &loglevel)
{
	if (loglevel == "ERROR")
	{
		softLogLevel = LOG_ERR;
	}
	else if (loglevel == "WARNING")
	{
		softLogLevel = LOG_WARNING;
	}
	else if (loglevel == "INFO")
	{
		softLogLevel = LOG_INFO;
	}
	else if (loglevel == "DEBUG")
	{
		softLogLevel = LOG_DEBUG;
	}
	else
	{
		ERROR_MSG("Unknown value (%s) for log.level in configuration", loglevel.c_str());
		return false;
	}

	return true;
}